

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

void __thiscall
Js::JavascriptArray::EnsureHeadStartsFromZero<int>(JavascriptArray *this,Recycler *recycler)

{
  SparseArraySegmentBase *pSVar1;
  bool bVar2;
  DynamicObjectFlags DVar3;
  SparseArraySegmentBase *pSVar4;
  Type *pTVar5;
  uint32 local_40;
  uint32 local_3c;
  uint32 size;
  uint32 size_1;
  
  pSVar1 = (this->head).ptr;
  if ((pSVar1 == (SparseArraySegmentBase *)0x0) || (pSVar1->left != 0)) {
    ClearSegmentMap(this);
    pSVar1 = (this->head).ptr;
    DVar3 = DynamicObject::GetArrayFlags((DynamicObject *)this);
    pTVar5 = (Type *)((long)this->segmentUnion + 0x20);
    if ((DVar3 & HasSegmentMap) == None) {
      pTVar5 = &this->segmentUnion;
    }
    _size = *pTVar5;
    SetHeadAndLastUsedSegment(this,EmptySegment);
    bVar2 = Phases::IsEnabled((Phases *)&DAT_015bbe90,NativeArrayLeafSegmentPhase);
    if ((pSVar1 != (SparseArraySegmentBase *)0x0) || (bVar2)) {
      local_3c = 0x12;
      SparseArraySegmentBase::EnsureSizeInBound(0,0,&local_3c,pSVar1);
      pSVar4 = &SparseArraySegment<int>::Allocate<false>(recycler,0,0,local_3c,0)->
                super_SparseArraySegmentBase;
    }
    else {
      local_40 = 0x12;
      SparseArraySegmentBase::EnsureSizeInBound(0,0,&local_40,(SparseArraySegmentBase *)0x0);
      pSVar4 = &SparseArraySegment<int>::Allocate<true>(recycler,0,0,local_40,0)->
                super_SparseArraySegmentBase;
    }
    Memory::Recycler::WBSetBit((char *)&pSVar4->next);
    (pSVar4->next).ptr = pSVar1;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&pSVar4->next);
    Memory::Recycler::WBSetBit((char *)&this->head);
    (this->head).ptr = pSVar4;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->head);
    DVar3 = DynamicObject::GetArrayFlags((DynamicObject *)this);
    DynamicObject::SetArrayFlags((DynamicObject *)this,DVar3 | HasNoMissingValues);
    SetLastUsedSegment(this,(SparseArraySegmentBase *)_size);
  }
  return;
}

Assistant:

void JavascriptArray::EnsureHeadStartsFromZero(Recycler * recycler)
    {
        if (head == nullptr || head->left != 0)
        {
            // This is used to fix up altered arrays.
            // any SegmentMap would be invalid at this point.
            ClearSegmentMap();

            //
            // We could OOM and throw when allocating new empty head, resulting in a corrupted array. Need
            // some protection here. Save the head and switch this array to EmptySegment. Will be restored
            // correctly if allocating new segment succeeds.
            //
            SparseArraySegment<T>* savedHead = SparseArraySegment<T>::From(this->head);
            SparseArraySegment<T>* savedLastUsedSegment = (SparseArraySegment<T>*)this->GetLastUsedSegment();
            SetHeadAndLastUsedSegment(const_cast<SparseArraySegmentBase*>(EmptySegment));

            SparseArraySegment<T> *newSeg = SparseArraySegment<T>::AllocateSegment(recycler, 0, 0, savedHead);
            newSeg->next = savedHead;
            this->head = newSeg;
            SetHasNoMissingValues();
            this->SetLastUsedSegment(savedLastUsedSegment);
        }
    }